

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_seh.cpp
# Opt level: O3

void badCallInner_Nullptr(void)

{
  double __x;
  StackInfo si;
  StackInfo local_48;
  
  local_48._vptr_StackInfo = (_func_int **)0x0;
  nodecpp::log::default_log::log<char_const*>
            ((ModuleID *)&local_48,info,
             "about to attempt to dereference a null pointer. Calling at ");
  nodecpp::StackInfo::StackInfo(&local_48,true);
  nodecpp::StackInfo::log(&local_48,__x);
  nodecpp::StackInfo::~StackInfo(&local_48);
  return;
}

Assistant:

void badCallInner_Nullptr()
{
	volatile int * ptr = nullptr;
#ifndef NODECPP_NO_STACK_INFO_IN_EXCEPTIONS
	nodecpp::log::default_log::info("about to attempt to dereference a null pointer. Calling at " );
	nodecpp::StackInfo si(true);
	si.log( nodecpp::log::LogLevel::fatal );
#endif // NODECPP_NO_STACK_INFO_IN_EXCEPTIONS
#if !defined NODECPP_CLANG // SEH implementation for clang is yet to be developed
    *ptr = 0;
#endif // NODECPP_CLANG
}